

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initProgramObjects
          (TessellationShaderTessellationMaxInOut *this)

{
  char *__s;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char **ppcVar5;
  ostream *poVar6;
  size_t sVar7;
  char *pcVar8;
  ResourceError *pRVar9;
  TestError *this_00;
  long lVar10;
  int iVar11;
  char *tes_code_1_raw_ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  char *tcs_code_1_raw_ptr;
  undefined8 local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  long local_1d8;
  char *tes_code_2_raw_ptr;
  char *tcs_code_2_raw_ptr;
  char *tf_varying_2;
  char *vs_code_raw_ptr;
  undefined1 local_1a8 [376];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar10 + 0x3c8))();
  this->m_po_id_1 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9c4);
  GVar3 = (**(code **)(lVar10 + 0x3c8))();
  this->m_po_id_2 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9c7);
  GVar3 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
  this->m_vs_id_1 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_VERTEX_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9cb);
  GVar3 = (**(code **)(lVar10 + 0x3f0))(0x8b31);
  this->m_vs_id_2 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_VERTEX_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9ce);
  GVar3 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  this->m_tcs_id_1 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9d1);
  GVar3 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  this->m_tcs_id_2 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9d4);
  GVar3 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_tes_id_1 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9d7);
  GVar3 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  this->m_tes_id_2 = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9da);
  GVar3 = (**(code **)(lVar10 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glCreateShader(GL_FRAGMENT_SHADER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x9dd);
  iVar2 = this->m_gl_max_tess_evaluation_output_components_value;
  iVar11 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar11 = iVar2;
  }
  ppcVar5 = (char **)malloc((long)(iVar11 >> 2) << 3);
  this->m_tf_varyings_names = ppcVar5;
  if (ppcVar5 == (char **)0x0) {
    pRVar9 = (ResourceError *)__cxa_allocate_exception(0x38);
    vs_code_raw_ptr = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&vs_code_raw_ptr,"Unable to allocate memory!","");
    tcu::ResourceError::ResourceError(pRVar9,(string *)&vs_code_raw_ptr);
    __cxa_throw(pRVar9,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = this->m_gl_max_tess_evaluation_output_components_value;
  iVar11 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar11 = iVar2;
  }
  local_1d8 = lVar10;
  if (iVar2 < 8) {
    iVar11 = iVar11 >> 2;
  }
  else {
    lVar10 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&vs_code_raw_ptr);
      local_1f0 = 0;
      local_1e8 = '\0';
      tcs_code_1_raw_ptr = &local_1e8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Vertex.value[",0xd);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)lVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&tcs_code_1_raw_ptr,(string *)&tes_code_1_raw_ptr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tes_code_1_raw_ptr != &local_208) {
        operator_delete(tes_code_1_raw_ptr,local_208._M_allocated_capacity + 1);
      }
      __s = tcs_code_1_raw_ptr;
      sVar7 = strlen(tcs_code_1_raw_ptr);
      pcVar8 = (char *)malloc(sVar7 + 1);
      this->m_tf_varyings_names[lVar10] = pcVar8;
      pcVar8 = this->m_tf_varyings_names[lVar10];
      if (pcVar8 == (char *)0x0) {
        pRVar9 = (ResourceError *)__cxa_allocate_exception(0x38);
        tes_code_1_raw_ptr = (char *)&local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&tes_code_1_raw_ptr,"Unable to allocate memory!","");
        tcu::ResourceError::ResourceError(pRVar9,(string *)&tes_code_1_raw_ptr);
        __cxa_throw(pRVar9,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
      }
      sVar7 = strlen(__s);
      memcpy(pcVar8,__s,sVar7 + 1);
      if (tcs_code_1_raw_ptr != &local_1e8) {
        operator_delete(tcs_code_1_raw_ptr,CONCAT71(uStack_1e7,local_1e8) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&vs_code_raw_ptr);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      lVar10 = lVar10 + 1;
      iVar2 = this->m_gl_max_tess_evaluation_output_components_value;
      iVar11 = iVar2 + 3;
      if (-1 < iVar2) {
        iVar11 = iVar2;
      }
      iVar11 = iVar11 >> 2;
    } while (lVar10 < iVar11 + -1);
  }
  pcVar8 = (char *)malloc(0xc);
  lVar10 = local_1d8;
  this->m_tf_varyings_names[(long)iVar11 + -1] = pcVar8;
  if (this->m_tf_varyings_names[(long)iVar11 + -1] == (char *)0x0) {
    pRVar9 = (ResourceError *)__cxa_allocate_exception(0x38);
    vs_code_raw_ptr = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&vs_code_raw_ptr,"Unable to allocate memory!","");
    tcu::ResourceError::ResourceError(pRVar9,(string *)&vs_code_raw_ptr);
    __cxa_throw(pRVar9,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  builtin_strncpy(this->m_tf_varyings_names[(long)iVar11 + -1],"gl_Position",0xc);
  iVar2 = this->m_gl_max_tess_evaluation_output_components_value;
  iVar11 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar11 = iVar2;
  }
  (**(code **)(local_1d8 + 0x14c8))(this->m_po_id_1,iVar11 >> 2,this->m_tf_varyings_names,0x8c8c);
  dVar4 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0xa0e);
  vs_code_raw_ptr = m_vs_code;
  tcs_code_1_raw_ptr = m_tcs_code_1;
  tes_code_1_raw_ptr = m_tes_code_1;
  tcs_code_2_raw_ptr = m_tcs_code_2;
  tes_code_2_raw_ptr = m_tes_code_2;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id_1,this->m_vs_id_1,1,&vs_code_raw_ptr,
                     this->m_tcs_id_1,1,&tcs_code_1_raw_ptr,this->m_tes_id_1,1,&tes_code_1_raw_ptr,
                     this->m_fs_id,1,&m_fs_code,(bool *)0x0);
  if (bVar1) {
    tf_varying_2 = "out_value";
    (**(code **)(lVar10 + 0x14c8))(this->m_po_id_2,1,&tf_varying_2,0x8c8c);
    dVar4 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar4,"glTransformFeedbackVaryings() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0xa23);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id_2,this->m_vs_id_2,1,&vs_code_raw_ptr,
                       this->m_tcs_id_2,1,&tcs_code_2_raw_ptr,this->m_tes_id_2,1,&tes_code_2_raw_ptr
                       ,this->m_fs_id,1,&m_fs_code,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not link second test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
               ,0xa2a);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not build first test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
               ,0xa1c);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationMaxInOut::initProgramObjects(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects. */
	m_po_id_1 = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed!");

	m_po_id_2 = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed!");

	/* Set up all the shader objects that will be used for the test */
	m_vs_id_1 = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_VERTEX_SHADER) failed!");

	m_vs_id_2 = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_VERTEX_SHADER) failed!");

	m_tcs_id_1 = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!");

	m_tcs_id_2 = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_CONTROL_SHADER_EXT) failed!");

	m_tes_id_1 = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!");

	m_tes_id_2 = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_TESS_EVALUATION_SHADER_EXT) failed!");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader(GL_FRAGMENT_SHADER) failed!");

	/* Transform Feedback setup for case 1
	 *
	 * Varyings array: m_tf_varyings_names[i <  m_gl_max_tess_evaluation_output_components_value / 4-1] == "Vertex.value[i]"
	 *                 m_tf_varyings_names[i == m_gl_max_tess_evaluation_output_components_value / 4-1] == "gl_Position"
	 */
	const char position_varying[] = "gl_Position";

	m_tf_varyings_names = (char**)malloc((m_gl_max_tess_evaluation_output_components_value / 4) * sizeof(char*));

	if (m_tf_varyings_names == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	for (int i = 0; i < (m_gl_max_tess_evaluation_output_components_value) / 4 /* attributes */ - 1 /* gl_Position */;
		 i++)
	{
		std::stringstream tf_varying_stream;
		const char*		  tf_varying_raw_ptr = DE_NULL;
		std::string		  tf_varying_string;

		tf_varying_stream << "Vertex.value[" << i << "]";
		tf_varying_string  = tf_varying_stream.str();
		tf_varying_raw_ptr = tf_varying_string.c_str();

		m_tf_varyings_names[i] = (char*)malloc(strlen(tf_varying_raw_ptr) + 1 /* '\0' */);
		if (m_tf_varyings_names[i] == DE_NULL)
		{
			throw tcu::ResourceError("Unable to allocate memory!");
		}

		memcpy(m_tf_varyings_names[i], tf_varying_raw_ptr, strlen(tf_varying_raw_ptr) + 1);
	}

	m_tf_varyings_names[m_gl_max_tess_evaluation_output_components_value / 4 - 1 /* gl_Position */] =
		(char*)malloc(sizeof(position_varying));
	if (m_tf_varyings_names[m_gl_max_tess_evaluation_output_components_value / 4 - 1 /* gl_Position */] == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	memcpy(m_tf_varyings_names[m_gl_max_tess_evaluation_output_components_value / 4 - 1 /* gl_Position */],
		   position_varying, sizeof(position_varying));

	/* Set up XFB */
	gl.transformFeedbackVaryings(m_po_id_1, m_gl_max_tess_evaluation_output_components_value / 4, m_tf_varyings_names,
								 GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");

	/* Set up program objects */
	const char* vs_code_raw_ptr	= m_vs_code;
	const char* tcs_code_1_raw_ptr = m_tcs_code_1;
	const char* tes_code_1_raw_ptr = m_tes_code_1;
	const char* tcs_code_2_raw_ptr = m_tcs_code_2;
	const char* tes_code_2_raw_ptr = m_tes_code_2;

	/* Build a program object to test case 1. */
	if (!TessellationShaderTessellationMaxInOut::buildProgram(m_po_id_1, m_vs_id_1, 1, &vs_code_raw_ptr, m_tcs_id_1, 1,
															  &tcs_code_1_raw_ptr, m_tes_id_1, 1, &tes_code_1_raw_ptr,
															  m_fs_id, 1, &m_fs_code))
	{
		TCU_FAIL("Could not build first test program object");
	}

	/* Tranform Feedback setup for case 2 */
	const char* const tf_varying_2 = "out_value";

	gl.transformFeedbackVaryings(m_po_id_2, 1 /* count */, &tf_varying_2, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed!");

	/* Build a program object for case 2 */
	if (!(TessellationShaderTessellationMaxInOut::buildProgram(m_po_id_2, m_vs_id_2, 1, &vs_code_raw_ptr, m_tcs_id_2, 1,
															   &tcs_code_2_raw_ptr, m_tes_id_2, 1, &tes_code_2_raw_ptr,
															   m_fs_id, 1, &m_fs_code)))
	{
		TCU_FAIL("Could not link second test program object");
	}
}